

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

int __thiscall
helics::apps::Connector::makeTargetConnection
          (Connector *this,string_view origin,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList,
          unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *possibleConnections,
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *aliases,function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                   *callback)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_01;
  basic_string_view<char,_std::char_traits<char>_> __args_1_02;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __args_01;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __args_02;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  string_view target;
  string_view target_00;
  string_view target_01;
  bool bVar1;
  reference pbVar2;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> _Var3;
  size_t in_RDX;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_RSI;
  char *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  Connector *in_stack_00000008;
  string_view in_stack_00000010;
  basic_string_view<char,_std::char_traits<char>_> *interfaceAlias;
  iterator __end7;
  iterator __begin7;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range7;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  interfaceAliasList;
  iterator located_1;
  Connection *option_1;
  iterator __end4;
  iterator __begin4;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *__range4;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> aliasOptions;
  basic_string_view<char,_std::char_traits<char>_> *alias_1;
  iterator __end3;
  iterator __begin3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range3;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList_1;
  basic_string_view<char,_std::char_traits<char>_> *alias;
  iterator __end5;
  iterator __begin5;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range5;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  iterator located;
  Connection *option;
  iterator __end2;
  iterator __begin2;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *__range2;
  vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> connectionOptions;
  int matched;
  unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffc98;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
  in_stack_fffffffffffffca0;
  size_t in_stack_fffffffffffffca8;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
  in_stack_fffffffffffffcb0;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true>
  in_stack_fffffffffffffcb8;
  size_t in_stack_fffffffffffffcc8;
  char *in_stack_fffffffffffffcd0;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_318;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_310;
  size_t local_308;
  char *local_300;
  size_t local_2f8;
  char *local_2f0;
  reference local_2e8;
  _Self local_2e0;
  _Self local_2d8;
  undefined1 *local_2d0;
  size_t local_2c8;
  char *pcStack_2c0;
  undefined1 local_2b8 [48];
  size_t local_288;
  char *pcStack_280;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_278;
  size_t sStack_270;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_268;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_260;
  reference local_258;
  Connection *local_250;
  __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
  local_248;
  undefined1 *local_240;
  size_t local_238;
  char *pcStack_230;
  undefined1 local_220 [24];
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *in_stack_fffffffffffffdf8;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *aliases_00;
  size_t in_stack_fffffffffffffe00;
  size_t sVar4;
  char *in_stack_fffffffffffffe08;
  char *pcVar5;
  _Self local_1e0;
  _Self local_1d8;
  undefined1 *local_1d0;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_1c8;
  size_t sStack_1c0;
  undefined1 local_1b8 [48];
  size_t local_188;
  char *pcStack_180;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_178;
  size_t sStack_170;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_168;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_160;
  size_t local_158;
  char *local_150;
  size_t local_148;
  char *local_140;
  reference local_138;
  _Self local_130;
  _Self local_128;
  undefined1 *local_120;
  size_t local_118;
  char *pcStack_110;
  undefined1 local_100 [52];
  int local_cc;
  size_t local_c8;
  char *pcStack_c0;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_b8;
  size_t sStack_b0;
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_a8 [3];
  _Node_iterator_base<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_90;
  reference local_88;
  Connection *local_80;
  __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
  local_78;
  undefined1 *local_70;
  undefined1 local_58 [28];
  int local_3c;
  unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *local_18;
  size_t sStack_10;
  int local_4;
  
  local_3c = 0;
  local_18 = in_RSI;
  sStack_10 = in_RDX;
  buildPossibleConnectionList(in_stack_00000008,in_stack_00000010,unaff_retaddr);
  local_70 = local_58;
  local_78._M_current =
       (Connection *)
       CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::begin
                 ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                  in_stack_fffffffffffffc98);
  local_80 = (Connection *)
             CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
             end((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                 in_stack_fffffffffffffc98);
  while (bVar1 = __gnu_cxx::
                 operator==<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                           ((__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                             *)in_stack_fffffffffffffca0._M_cur,
                            (__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                             *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_88 = __gnu_cxx::
               __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
               ::operator*(&local_78);
    in_stack_fffffffffffffcb8._M_cur =
         (__node_type *)
         CLI::std::
         unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::find(in_stack_fffffffffffffc98,(key_type *)0x1f1ff4);
    local_90._M_cur = in_stack_fffffffffffffcb8._M_cur;
    local_a8[0]._M_cur =
         (__node_type *)
         CLI::std::
         unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end(in_stack_fffffffffffffc98);
    bVar1 = CLI::std::__detail::operator==(&local_90,local_a8);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      bVar1 = CLI::std::
              unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)0x1f20f8);
      if (!bVar1) {
        local_118 = (local_88->interface2)._M_len;
        pcStack_110 = (local_88->interface2)._M_str;
        target._M_str = in_stack_fffffffffffffe08;
        target._M_len = in_stack_fffffffffffffe00;
        generateAliases(target,in_stack_fffffffffffffdf8);
        local_120 = local_100;
        local_128._M_node =
             (_Base_ptr)
             CLI::std::
             set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)in_stack_fffffffffffffc98);
        local_130._M_node =
             (_Base_ptr)
             CLI::std::
             set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    *)in_stack_fffffffffffffc98);
        while (bVar1 = CLI::std::operator==(&local_128,&local_130), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_138 = CLI::std::
                      _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                      ::operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                   *)0x1f21a2);
          local_148 = local_138->_M_len;
          local_140 = local_138->_M_str;
          local_158 = (local_88->interface2)._M_len;
          local_150 = (local_88->interface2)._M_str;
          __x._M_str = in_stack_fffffffffffffcd0;
          __x._M_len = in_stack_fffffffffffffcc8;
          __y._M_str = in_RDI;
          __y._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
          bVar1 = std::operator==(__x,__y);
          if (!bVar1) {
            in_stack_fffffffffffffcb0._M_cur =
                 (__node_type *)
                 CLI::std::
                 unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::find(in_stack_fffffffffffffc98,(key_type *)0x1f222e);
            local_160._M_cur = in_stack_fffffffffffffcb0._M_cur;
            local_90._M_cur = in_stack_fffffffffffffcb0._M_cur;
            local_168._M_cur =
                 (__node_type *)
                 CLI::std::
                 unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 ::end(in_stack_fffffffffffffc98);
            bVar1 = CLI::std::__detail::operator==(&local_90,&local_168);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              local_178 = local_18;
              sStack_170 = sStack_10;
              local_188 = (local_88->interface2)._M_len;
              pcStack_180 = (local_88->interface2)._M_str;
              __args_00._M_str = in_RDI;
              __args_00._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
              __args_1_00._M_str = (char *)in_stack_fffffffffffffcb0._M_cur;
              __args_1_00._M_len = in_stack_fffffffffffffca8;
              CLI::std::
              function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)in_stack_fffffffffffffca0._M_cur,__args_00,__args_1_00);
              local_3c = local_3c + 1;
              if ((in_RDI[0x1b9] & 1U) == 0) {
                local_cc = 1;
                local_4 = local_3c;
                goto LAB_001f235b;
              }
              break;
            }
          }
          CLI::std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
          ::operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                        *)in_stack_fffffffffffffca0._M_cur);
        }
        local_cc = 0;
LAB_001f235b:
        CLI::std::
        set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)0x1f2368);
        if (local_cc != 0) goto LAB_001f2995;
      }
    }
    else {
      local_b8 = local_18;
      sStack_b0 = sStack_10;
      local_c8 = (local_88->interface2)._M_len;
      pcStack_c0 = (local_88->interface2)._M_str;
      __args._M_str = in_RDI;
      __args._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
      __args_1._M_str = (char *)in_stack_fffffffffffffcb0._M_cur;
      __args_1._M_len = in_stack_fffffffffffffca8;
      CLI::std::
      function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
      ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    *)in_stack_fffffffffffffca0._M_cur,__args,__args_1);
      local_3c = local_3c + 1;
      if ((in_RDI[0x1b9] & 1U) == 0) {
        local_cc = 1;
        local_4 = local_3c;
        goto LAB_001f2995;
      }
    }
    __gnu_cxx::
    __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
    ::operator++(&local_78);
  }
  bVar1 = CLI::std::
          unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)0x1f239e);
  if (!bVar1) {
    local_1c8 = local_18;
    sStack_1c0 = sStack_10;
    target_00._M_str = in_stack_fffffffffffffe08;
    target_00._M_len = in_stack_fffffffffffffe00;
    generateAliases(target_00,in_stack_fffffffffffffdf8);
    local_1d0 = local_1b8;
    local_1d8._M_node =
         (_Base_ptr)
         CLI::std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffc98);
    local_1e0._M_node =
         (_Base_ptr)
         CLI::std::
         set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)in_stack_fffffffffffffc98);
    while (bVar1 = CLI::std::operator==(&local_1d8,&local_1e0), ((bVar1 ^ 0xffU) & 1) != 0) {
      pbVar2 = CLI::std::
               _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
               operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                          *)0x1f2444);
      pcVar5 = (char *)pbVar2->_M_len;
      __x_00._M_str = in_stack_fffffffffffffcd0;
      __x_00._M_len = in_stack_fffffffffffffcc8;
      __y_00._M_str = in_RDI;
      __y_00._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
      aliases_00 = local_18;
      sVar4 = sStack_10;
      bVar1 = std::operator==(__x_00,__y_00);
      if (!bVar1) {
        local_238 = pbVar2->_M_len;
        pcStack_230 = pbVar2->_M_str;
        buildPossibleConnectionList(in_stack_00000008,in_stack_00000010,unaff_retaddr);
        local_240 = local_220;
        local_248._M_current =
             (Connection *)
             CLI::std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::
             begin((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                   in_stack_fffffffffffffc98);
        local_250 = (Connection *)
                    CLI::std::
                    vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::end
                              ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>
                                *)in_stack_fffffffffffffc98);
        while (bVar1 = __gnu_cxx::
                       operator==<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                                 ((__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                                   *)in_stack_fffffffffffffca0._M_cur,
                                  (__normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                                   *)in_stack_fffffffffffffc98), ((bVar1 ^ 0xffU) & 1) != 0) {
          local_258 = __gnu_cxx::
                      __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
                      ::operator*(&local_248);
          _Var3._M_cur = (__node_type *)
                         CLI::std::
                         unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ::find(in_stack_fffffffffffffc98,(key_type *)0x1f2582);
          local_260._M_cur = _Var3._M_cur;
          local_268._M_cur =
               (__node_type *)
               CLI::std::
               unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end(in_stack_fffffffffffffc98);
          bVar1 = CLI::std::__detail::operator==(&local_260,&local_268);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            bVar1 = CLI::std::
                    unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    ::empty((unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             *)0x1f269f);
            if (!bVar1) {
              local_2c8 = (local_258->interface2)._M_len;
              pcStack_2c0 = (local_258->interface2)._M_str;
              target_01._M_str = pcVar5;
              target_01._M_len = sVar4;
              generateAliases(target_01,aliases_00);
              local_2d0 = local_2b8;
              local_2d8._M_node =
                   (_Base_ptr)
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::begin((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)in_stack_fffffffffffffc98);
              local_2e0._M_node =
                   (_Base_ptr)
                   CLI::std::
                   set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ::end((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)in_stack_fffffffffffffc98);
              while (bVar1 = CLI::std::operator==(&local_2d8,&local_2e0), ((bVar1 ^ 0xffU) & 1) != 0
                    ) {
                local_2e8 = CLI::std::
                            _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ::operator*((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                                         *)0x1f2749);
                local_2f8 = pbVar2->_M_len;
                local_2f0 = pbVar2->_M_str;
                local_308 = (local_258->interface2)._M_len;
                local_300 = (local_258->interface2)._M_str;
                __x_01._M_str = in_stack_fffffffffffffcd0;
                __x_01._M_len = in_stack_fffffffffffffcc8;
                __y_01._M_str = in_RDI;
                __y_01._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
                bVar1 = std::operator==(__x_01,__y_01);
                if (!bVar1) {
                  in_stack_fffffffffffffca0._M_cur =
                       (__node_type *)
                       CLI::std::
                       unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::find(in_stack_fffffffffffffc98,(key_type *)0x1f27bd);
                  local_310._M_cur = in_stack_fffffffffffffca0._M_cur;
                  local_260._M_cur = in_stack_fffffffffffffca0._M_cur;
                  local_318._M_cur =
                       (__node_type *)
                       CLI::std::
                       unordered_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ::end(in_stack_fffffffffffffc98);
                  bVar1 = CLI::std::__detail::operator==(&local_260,&local_318);
                  if (((bVar1 ^ 0xffU) & 1) != 0) {
                    in_stack_fffffffffffffcc8 = (local_258->interface2)._M_len;
                    in_stack_fffffffffffffcd0 = (local_258->interface2)._M_str;
                    __args_02._M_str = in_RDI;
                    __args_02._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
                    __args_1_02._M_str = (char *)in_stack_fffffffffffffcb0._M_cur;
                    __args_1_02._M_len = (size_t)_Var3._M_cur;
                    CLI::std::
                    function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                    ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                                  *)in_stack_fffffffffffffca0._M_cur,__args_02,__args_1_02);
                    local_3c = local_3c + 1;
                    if ((in_RDI[0x1b9] & 1U) == 0) {
                      local_cc = 1;
                      local_4 = local_3c;
                      goto LAB_001f28cc;
                    }
                    break;
                  }
                }
                CLI::std::
                _Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
                operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>
                            *)in_stack_fffffffffffffca0._M_cur);
              }
              local_cc = 0;
LAB_001f28cc:
              CLI::std::
              set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)0x1f28d9);
              if (local_cc != 0) goto LAB_001f2909;
            }
          }
          else {
            local_278 = local_18;
            sStack_270 = sStack_10;
            local_288 = (local_258->interface2)._M_len;
            pcStack_280 = (local_258->interface2)._M_str;
            __args_01._M_str = in_RDI;
            __args_01._M_len = (size_t)in_stack_fffffffffffffcb8._M_cur;
            __args_1_01._M_str = (char *)in_stack_fffffffffffffcb0._M_cur;
            __args_1_01._M_len = (size_t)_Var3._M_cur;
            CLI::std::
            function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
            ::operator()((function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)in_stack_fffffffffffffca0._M_cur,__args_01,__args_1_01);
            local_3c = local_3c + 1;
            if ((in_RDI[0x1b9] & 1U) == 0) {
              local_cc = 1;
              local_4 = local_3c;
              goto LAB_001f2909;
            }
          }
          __gnu_cxx::
          __normal_iterator<helics::apps::Connection_*,_std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>_>
          ::operator++(&local_248);
        }
        local_cc = 0;
LAB_001f2909:
        std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
                  ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
                   in_stack_fffffffffffffcb0._M_cur);
        if (local_cc != 0) goto LAB_001f2951;
      }
      CLI::std::_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>::
      operator++((_Rb_tree_const_iterator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 in_stack_fffffffffffffca0._M_cur);
    }
    local_cc = 0;
LAB_001f2951:
    CLI::std::
    set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~set((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x1f295e);
    if (local_cc != 0) goto LAB_001f2995;
  }
  local_4 = local_3c;
  local_cc = 1;
LAB_001f2995:
  std::vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_>::~vector
            ((vector<helics::apps::Connection,_std::allocator<helics::apps::Connection>_> *)
             in_stack_fffffffffffffcb0._M_cur);
  return local_4;
}

Assistant:

int Connector::makeTargetConnection(
    std::string_view origin,
    const std::vector<std::size_t>& tagList,
    std::unordered_set<std::string_view>& possibleConnections,
    const std::unordered_multimap<std::string_view, std::string_view>& aliases,
    const std::function<void(std::string_view, std::string_view)>& callback)
{
    int matched{0};
    auto connectionOptions = buildPossibleConnectionList(origin, tagList);
    for (const auto& option : connectionOptions) {
        auto located = possibleConnections.find(option.interface2);
        if (located != possibleConnections.end()) {
            /* source, target*/
            callback(origin, option.interface2);
            ++matched;
            if (!matchMultiple) {
                return matched;
            }

        } else {
            if (!aliases.empty()) {
                auto aliasList = generateAliases(option.interface2, aliases);
                for (const auto& alias : aliasList) {
                    if (alias == option.interface2) {
                        continue;
                    }
                    located = possibleConnections.find(alias);
                    if (located != possibleConnections.end()) {
                        callback(origin, option.interface2);
                        ++matched;
                        if (!matchMultiple) {
                            return matched;
                        }
                        break;
                    }
                }
            }
        }
    }
    if (!aliases.empty()) {
        auto aliasList = generateAliases(origin, aliases);
        for (const auto& alias : aliasList) {
            if (alias == origin) {
                continue;
            }
            auto aliasOptions = buildPossibleConnectionList(alias, tagList);
            for (const auto& option : aliasOptions) {
                auto located = possibleConnections.find(option.interface2);
                if (located != possibleConnections.end()) {
                    /* source, target*/
                    callback(origin, option.interface2);
                    ++matched;
                    if (!matchMultiple) {
                        return matched;
                    }

                } else {
                    if (!aliases.empty()) {
                        auto interfaceAliasList = generateAliases(option.interface2, aliases);
                        for (const auto& interfaceAlias : interfaceAliasList) {
                            if (alias == option.interface2) {
                                continue;
                            }
                            located = possibleConnections.find(interfaceAlias);
                            if (located != possibleConnections.end()) {
                                callback(origin, option.interface2);
                                ++matched;
                                if (!matchMultiple) {
                                    return matched;
                                }
                                break;
                            }
                        }
                    }
                }
            }
        }
    }
    return matched;
}